

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall trieste::NodeDef::include(NodeDef *this)

{
  element_type *peVar1;
  runtime_error *this_00;
  Node st;
  shared_ptr<trieste::NodeDef> local_30;
  element_type *local_20;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  scope((NodeDef *)&stack0xffffffffffffffe0);
  if (local_20 != (element_type *)0x0) {
    peVar1 = (local_20->symtab_).super___shared_ptr<trieste::SymtabDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<trieste::NodeDef,void>
              ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
    ::emplace_back<std::shared_ptr<trieste::NodeDef>>
              ((vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>
                *)&peVar1->includes,&local_30);
    if (local_30.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"No symbol table");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void include()
    {
      auto st = scope();

      if (!st)
        throw std::runtime_error("No symbol table");

      st->symtab_->includes.emplace_back(shared_from_this());
    }